

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemInformation.cxx
# Opt level: O0

string * __thiscall
cmsys::SystemInformationImplementation::ParseValueFromKStat_abi_cxx11_
          (string *__return_storage_ptr__,SystemInformationImplementation *this,char *arguments)

{
  bool bVar1;
  bool bVar2;
  pointer ppcVar3;
  char *pcVar4;
  string local_170 [8];
  string val;
  size_t i;
  vector<const_char_*,_std::allocator<const_char_*>_> local_140;
  undefined1 local_128 [8];
  string buffer;
  value_type local_100;
  string local_f8 [8];
  string lastArg;
  ulong local_d0;
  size_t quotes;
  string arg;
  size_t b1;
  size_t b0;
  ulong uStack_90;
  bool inQuotes;
  size_t pos;
  size_t start;
  string local_78 [8];
  string command;
  char *local_40;
  undefined1 local_38 [8];
  vector<const_char_*,_std::allocator<const_char_*>_> args;
  char *arguments_local;
  SystemInformationImplementation *this_local;
  string *value;
  
  args.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)arguments;
  std::vector<const_char_*,_std::allocator<const_char_*>_>::vector
            ((vector<const_char_*,_std::allocator<const_char_*>_> *)local_38);
  std::vector<const_char_*,_std::allocator<const_char_*>_>::clear
            ((vector<const_char_*,_std::allocator<const_char_*>_> *)local_38);
  local_40 = "kstat";
  std::vector<const_char_*,_std::allocator<const_char_*>_>::push_back
            ((vector<const_char_*,_std::allocator<const_char_*>_> *)local_38,&local_40);
  command.field_2._8_8_ = anon_var_dwarf_679d2f;
  std::vector<const_char_*,_std::allocator<const_char_*>_>::push_back
            ((vector<const_char_*,_std::allocator<const_char_*>_> *)local_38,
             (value_type *)((long)&command.field_2 + 8));
  ppcVar3 = args.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_78,(char *)ppcVar3,(allocator *)((long)&start + 7));
  std::allocator<char>::~allocator((allocator<char> *)((long)&start + 7));
  uStack_90 = std::__cxx11::string::find((char)local_78,0x20);
  do {
    if (uStack_90 == 0xffffffffffffffff) {
      std::__cxx11::string::size();
      std::__cxx11::string::substr((ulong)local_f8,(ulong)local_78);
      local_100 = (value_type)std::__cxx11::string::c_str();
      std::vector<const_char_*,_std::allocator<const_char_*>_>::push_back
                ((vector<const_char_*,_std::allocator<const_char_*>_> *)local_38,&local_100);
      buffer.field_2._8_8_ = 0;
      std::vector<const_char_*,_std::allocator<const_char_*>_>::push_back
                ((vector<const_char_*,_std::allocator<const_char_*>_> *)local_38,
                 (value_type *)((long)&buffer.field_2 + 8));
      std::vector<const_char_*,_std::allocator<const_char_*>_>::vector
                (&local_140,(vector<const_char_*,_std::allocator<const_char_*>_> *)local_38);
      RunProcess_abi_cxx11_((string *)local_128,this,&local_140);
      std::vector<const_char_*,_std::allocator<const_char_*>_>::~vector(&local_140);
      i._7_1_ = 0;
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)__return_storage_ptr__,"",(allocator *)((long)&i + 6));
      std::allocator<char>::~allocator((allocator<char> *)((long)&i + 6));
      val.field_2._8_8_ = std::__cxx11::string::size();
      while (((val.field_2._8_8_ = val.field_2._8_8_ + -1, val.field_2._8_8_ != 0 &&
              (pcVar4 = (char *)std::__cxx11::string::operator[]((ulong)local_128), *pcVar4 != ' '))
             && (pcVar4 = (char *)std::__cxx11::string::operator[]((ulong)local_128),
                *pcVar4 != '\t'))) {
        pcVar4 = (char *)std::__cxx11::string::operator[]((ulong)local_128);
        if ((*pcVar4 != '\n') &&
           (pcVar4 = (char *)std::__cxx11::string::operator[]((ulong)local_128), *pcVar4 != '\r')) {
          std::__cxx11::string::string(local_170,(string *)__return_storage_ptr__);
          pcVar4 = (char *)std::__cxx11::string::operator[]((ulong)local_128);
          std::__cxx11::string::operator=((string *)__return_storage_ptr__,*pcVar4);
          std::__cxx11::string::operator+=((string *)__return_storage_ptr__,local_170);
          std::__cxx11::string::~string(local_170);
        }
      }
      i._7_1_ = 1;
      std::__cxx11::string::~string((string *)local_128);
      std::__cxx11::string::~string(local_f8);
      std::__cxx11::string::~string(local_78);
      std::vector<const_char_*,_std::allocator<const_char_*>_>::~vector
                ((vector<const_char_*,_std::allocator<const_char_*>_> *)local_38);
      return __return_storage_ptr__;
    }
    bVar2 = false;
    b1 = std::__cxx11::string::find((char)local_78,0x22);
    arg.field_2._8_8_ = std::__cxx11::string::find((char)local_78,0x22);
    while( true ) {
      bVar1 = false;
      if ((b1 != 0xffffffffffffffff) && (bVar1 = false, arg.field_2._8_8_ != -1)) {
        bVar1 = b1 < (ulong)arg.field_2._8_8_;
      }
      if (!bVar1) goto LAB_00792525;
      if ((b1 < uStack_90) && (uStack_90 < (ulong)arg.field_2._8_8_)) break;
      b1 = std::__cxx11::string::find((char)local_78,0x22);
      arg.field_2._8_8_ = std::__cxx11::string::find((char)local_78,0x22);
    }
    bVar2 = true;
LAB_00792525:
    if (!bVar2) {
      std::__cxx11::string::substr((ulong)&quotes,(ulong)local_78);
      local_d0 = std::__cxx11::string::find((char)&quotes,0x22);
      while (local_d0 != 0xffffffffffffffff) {
        std::__cxx11::string::erase((ulong)&quotes,local_d0);
        local_d0 = std::__cxx11::string::find((char)&quotes,0x22);
      }
      lastArg.field_2._8_8_ = std::__cxx11::string::c_str();
      std::vector<const_char_*,_std::allocator<const_char_*>_>::push_back
                ((vector<const_char_*,_std::allocator<const_char_*>_> *)local_38,
                 (value_type *)((long)&lastArg.field_2 + 8));
      std::__cxx11::string::~string((string *)&quotes);
    }
    uStack_90 = std::__cxx11::string::find((char)local_78,0x20);
  } while( true );
}

Assistant:

kwsys_stl::string SystemInformationImplementation::ParseValueFromKStat(const char* arguments)
{
  kwsys_stl::vector<const char*> args;
  args.clear();
  args.push_back("kstat");
  args.push_back("-p");

  kwsys_stl::string command = arguments;
  size_t start = command.npos;
  size_t pos = command.find(' ',0);
  while(pos!=command.npos)
    {
    bool inQuotes = false;
    // Check if we are between quotes
    size_t b0 = command.find('"',0);
    size_t b1 = command.find('"',b0+1);
    while(b0 != command.npos && b1 != command.npos && b1>b0)
      {
      if(pos>b0 && pos<b1)
        {
        inQuotes = true;
        break;
        }
      b0 = command.find('"',b1+1);
      b1 = command.find('"',b0+1);
      }

    if(!inQuotes)
      {
      kwsys_stl::string arg = command.substr(start+1,pos-start-1);

      // Remove the quotes if any
      size_t quotes = arg.find('"');
      while(quotes != arg.npos)
        {
        arg.erase(quotes,1);
        quotes = arg.find('"');
        }
      args.push_back(arg.c_str());
      start = pos;
      }
    pos = command.find(' ',pos+1);
    }
  kwsys_stl::string lastArg = command.substr(start+1,command.size()-start-1);
  args.push_back(lastArg.c_str());

  args.push_back(0);

  kwsys_stl::string buffer = this->RunProcess(args);

  kwsys_stl::string value = "";
  for(size_t i=buffer.size()-1;i>0;i--)
    {
    if(buffer[i] == ' ' || buffer[i] == '\t')
      {
      break;
      }
    if(buffer[i] != '\n' && buffer[i] != '\r')
      {
      kwsys_stl::string val = value;
      value = buffer[i];
      value += val;
      }
    }
  return value;
}